

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_type.cpp
# Opt level: O0

czstring pstore::http::media_type_from_extension(czstring extension)

{
  bool bVar1;
  int iVar2;
  media_type_entry *pmVar3;
  media_type_entry *pos;
  czstring local_10;
  czstring extension_local;
  
  local_10 = extension;
  bVar1 = std::
          is_sorted<(anonymous_namespace)::media_type_entry_const*,pstore::http::media_type_from_extension(char_const*)::__0>
                    ((anonymous_namespace)::media_types,&media_type_from_extension::end);
  if (!bVar1) {
    assert_failed("std::is_sorted ( begin, end, [] (media_type_entry const & lhs, media_type_entry const & rhs) noexcept { return std::strcmp (lhs.name, rhs.name) < 0; })"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/http/media_type.cpp"
                  ,0x3a);
  }
  pmVar3 = std::
           lower_bound<(anonymous_namespace)::media_type_entry_const*,char_const*,pstore::http::media_type_from_extension(char_const*)::__1>
                     ((anonymous_namespace)::media_types,&media_type_from_extension::end,&local_10);
  if ((pmVar3 != (media_type_entry *)&media_type_from_extension::end) &&
     (iVar2 = strcmp(local_10,pmVar3->name), iVar2 == 0)) {
    return pmVar3->media_type;
  }
  return "application/octet-stream";
}

Assistant:

gsl::czstring PSTORE_NONNULL
        media_type_from_extension (gsl::czstring const PSTORE_NONNULL extension) {
            static auto const begin = std::begin (media_types);
            static auto const end = std::end (media_types);

            PSTORE_ASSERT (std::is_sorted (
                begin, end,
                [] (media_type_entry const & lhs, media_type_entry const & rhs) noexcept {
                    return std::strcmp (lhs.name, rhs.name) < 0;
                }));

            auto const pos = std::lower_bound (
                begin, end, extension,
                [] (media_type_entry const & mte, gsl::czstring const ext) noexcept {
                    return std::strcmp (mte.name, ext) < 0;
                });
            return pos != end && std::strcmp (extension, pos->name) == 0
                       ? pos->media_type
                       : "application/octet-stream";
        }